

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O0

void demo_draw(demo *demo)

{
  undefined1 local_d8 [8];
  VkPresentInfoKHR present;
  VkSubmitInfo submit_info;
  VkPipelineStageFlags pipe_stage_flags;
  VkFence nullFence;
  VkSemaphoreCreateInfo semaphoreCreateInfo;
  VkSemaphore drawCompleteSemaphore;
  VkSemaphore imageAcquiredSemaphore;
  demo *pdStack_10;
  VkResult err;
  demo *demo_local;
  
  nullFence = (VkFence)0x9;
  semaphoreCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  semaphoreCreateInfo._4_4_ = 0;
  semaphoreCreateInfo.pNext = (void *)0x0;
  pdStack_10 = demo;
  imageAcquiredSemaphore._4_4_ =
       (*glad_vkCreateSemaphore)
                 (demo->device,(VkSemaphoreCreateInfo *)&nullFence,(VkAllocationCallbacks *)0x0,
                  &drawCompleteSemaphore);
  if (imageAcquiredSemaphore._4_4_ != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                  ,500,"void demo_draw(struct demo *)");
  }
  imageAcquiredSemaphore._4_4_ =
       (*glad_vkCreateSemaphore)
                 (pdStack_10->device,(VkSemaphoreCreateInfo *)&nullFence,
                  (VkAllocationCallbacks *)0x0,(VkSemaphore *)&semaphoreCreateInfo.flags);
  if (imageAcquiredSemaphore._4_4_ == VK_SUCCESS) {
    imageAcquiredSemaphore._4_4_ =
         (*glad_vkAcquireNextImageKHR)
                   (pdStack_10->device,pdStack_10->swapchain,0xffffffffffffffff,
                    drawCompleteSemaphore,(VkFence)0x0,&pdStack_10->current_buffer);
    if (imageAcquiredSemaphore._4_4_ == VK_ERROR_OUT_OF_DATE_KHR) {
      demo_resize(pdStack_10);
      demo_draw(pdStack_10);
      (*glad_vkDestroySemaphore)
                (pdStack_10->device,drawCompleteSemaphore,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroySemaphore)
                (pdStack_10->device,(VkSemaphore)semaphoreCreateInfo._16_8_,
                 (VkAllocationCallbacks *)0x0);
    }
    else {
      if ((imageAcquiredSemaphore._4_4_ != VK_SUBOPTIMAL_KHR) &&
         (imageAcquiredSemaphore._4_4_ != VK_SUCCESS)) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x20b,"void demo_draw(struct demo *)");
      }
      demo_flush_init_cmd(pdStack_10);
      demo_draw_build_cmd(pdStack_10);
      submit_info.pSignalSemaphores._4_4_ = 0x2000;
      present.pResults._0_4_ = 4;
      submit_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      submit_info._4_4_ = 0;
      submit_info.pNext._0_4_ = 1;
      submit_info._16_8_ = &drawCompleteSemaphore;
      submit_info.pWaitSemaphores = (VkSemaphore *)((long)&submit_info.pSignalSemaphores + 4);
      submit_info.pWaitDstStageMask._0_4_ = 1;
      submit_info._40_8_ = &pdStack_10->draw_cmd;
      submit_info.pCommandBuffers._0_4_ = 1;
      submit_info._56_8_ = &semaphoreCreateInfo.flags;
      imageAcquiredSemaphore._4_4_ =
           (*glad_vkQueueSubmit)(pdStack_10->queue,1,(VkSubmitInfo *)&present.pResults,(VkFence)0x0)
      ;
      if (imageAcquiredSemaphore._4_4_ != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x224,"void demo_draw(struct demo *)");
      }
      local_d8._0_4_ = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR;
      present.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      present._4_4_ = 0;
      present.pNext._0_4_ = 1;
      present._16_8_ = &semaphoreCreateInfo.flags;
      present.pWaitSemaphores._0_4_ = 1;
      present._32_8_ = &pdStack_10->swapchain;
      present.pSwapchains = (VkSwapchainKHR *)&pdStack_10->current_buffer;
      present.pImageIndices = (uint32_t *)0x0;
      imageAcquiredSemaphore._4_4_ =
           (*glad_vkQueuePresentKHR)(pdStack_10->queue,(VkPresentInfoKHR *)local_d8);
      if (imageAcquiredSemaphore._4_4_ == VK_ERROR_OUT_OF_DATE_KHR) {
        demo_resize(pdStack_10);
      }
      else if ((imageAcquiredSemaphore._4_4_ != VK_SUBOPTIMAL_KHR) &&
              (imageAcquiredSemaphore._4_4_ != VK_SUCCESS)) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x239,"void demo_draw(struct demo *)");
      }
      imageAcquiredSemaphore._4_4_ = (*glad_vkQueueWaitIdle)(pdStack_10->queue);
      if (imageAcquiredSemaphore._4_4_ != VK_SUCCESS) {
        __assert_fail("err == VK_SUCCESS",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                      ,0x23d,"void demo_draw(struct demo *)");
      }
      (*glad_vkDestroySemaphore)
                (pdStack_10->device,drawCompleteSemaphore,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroySemaphore)
                (pdStack_10->device,(VkSemaphore)semaphoreCreateInfo._16_8_,
                 (VkAllocationCallbacks *)0x0);
    }
    return;
  }
  __assert_fail("!err",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/tests/triangle-vulkan.c"
                ,0x1f8,"void demo_draw(struct demo *)");
}

Assistant:

static void demo_draw(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;
    VkSemaphore imageAcquiredSemaphore, drawCompleteSemaphore;
    VkSemaphoreCreateInfo semaphoreCreateInfo = {
        .sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO,
        .pNext = NULL,
        .flags = 0,
    };

    err = vkCreateSemaphore(demo->device, &semaphoreCreateInfo,
                            NULL, &imageAcquiredSemaphore);
    assert(!err);

    err = vkCreateSemaphore(demo->device, &semaphoreCreateInfo,
                            NULL, &drawCompleteSemaphore);
    assert(!err);

    // Get the index of the next available swapchain image:
    err = vkAcquireNextImageKHR(demo->device, demo->swapchain, UINT64_MAX,
                                imageAcquiredSemaphore,
                                (VkFence)0, // TODO: Show use of fence
                                &demo->current_buffer);
    if (err == VK_ERROR_OUT_OF_DATE_KHR) {
        // demo->swapchain is out of date (e.g. the window was resized) and
        // must be recreated:
        demo_resize(demo);
        demo_draw(demo);
        vkDestroySemaphore(demo->device, imageAcquiredSemaphore, NULL);
        vkDestroySemaphore(demo->device, drawCompleteSemaphore, NULL);
        return;
    } else if (err == VK_SUBOPTIMAL_KHR) {
        // demo->swapchain is not as optimal as it could be, but the platform's
        // presentation engine will still present the image correctly.
    } else {
        assert(!err);
    }

    demo_flush_init_cmd(demo);

    // Wait for the present complete semaphore to be signaled to ensure
    // that the image won't be rendered to until the presentation
    // engine has fully released ownership to the application, and it is
    // okay to render to the image.

    demo_draw_build_cmd(demo);
    VkFence nullFence = VK_NULL_HANDLE;
    VkPipelineStageFlags pipe_stage_flags =
        VK_PIPELINE_STAGE_BOTTOM_OF_PIPE_BIT;
    VkSubmitInfo submit_info = {.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO,
                                .pNext = NULL,
                                .waitSemaphoreCount = 1,
                                .pWaitSemaphores = &imageAcquiredSemaphore,
                                .pWaitDstStageMask = &pipe_stage_flags,
                                .commandBufferCount = 1,
                                .pCommandBuffers = &demo->draw_cmd,
                                .signalSemaphoreCount = 1,
                                .pSignalSemaphores = &drawCompleteSemaphore};

    err = vkQueueSubmit(demo->queue, 1, &submit_info, nullFence);
    assert(!err);

    VkPresentInfoKHR present = {
        .sType = VK_STRUCTURE_TYPE_PRESENT_INFO_KHR,
        .pNext = NULL,
        .waitSemaphoreCount = 1,
        .pWaitSemaphores = &drawCompleteSemaphore,
        .swapchainCount = 1,
        .pSwapchains = &demo->swapchain,
        .pImageIndices = &demo->current_buffer,
    };

    err = vkQueuePresentKHR(demo->queue, &present);
    if (err == VK_ERROR_OUT_OF_DATE_KHR) {
        // demo->swapchain is out of date (e.g. the window was resized) and
        // must be recreated:
        demo_resize(demo);
    } else if (err == VK_SUBOPTIMAL_KHR) {
        // demo->swapchain is not as optimal as it could be, but the platform's
        // presentation engine will still present the image correctly.
    } else {
        assert(!err);
    }

    err = vkQueueWaitIdle(demo->queue);
    assert(err == VK_SUCCESS);

    vkDestroySemaphore(demo->device, imageAcquiredSemaphore, NULL);
    vkDestroySemaphore(demo->device, drawCompleteSemaphore, NULL);
}